

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O0

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyBufferFromStart<SmallStructs>
          (VerifierTemplate<false> *this,char *identifier,size_t start)

{
  bool bVar1;
  size_t sVar2;
  bool local_39;
  size_t o;
  size_t start_local;
  char *identifier_local;
  VerifierTemplate<false> *this_local;
  
  bVar1 = Check(this,0xb < this->size_);
  if (bVar1) {
    if (identifier != (char *)0x0) {
      local_39 = false;
      if (7 < this->size_) {
        local_39 = BufferHasIdentifier(this->buf_ + start,identifier,false);
      }
      bVar1 = Check(this,local_39);
      if (!bVar1) {
        return false;
      }
    }
    sVar2 = VerifyOffset<unsigned_int,int>(this,start);
    bVar1 = Check(this,sVar2 != 0);
    if (bVar1) {
      bVar1 = SmallStructs::Verify((SmallStructs *)(this->buf_ + sVar2 + start),this);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool VerifyBufferFromStart(const char *const identifier, const size_t start) {
    // Buffers have to be of some size to be valid. The reason it is a runtime
    // check instead of static_assert, is that nested flatbuffers go through
    // this call and their size is determined at runtime.
    if (!Check(size_ >= FLATBUFFERS_MIN_BUFFER_SIZE)) return false;

    // If an identifier is provided, check that we have a buffer
    if (identifier && !Check((size_ >= 2 * sizeof(flatbuffers::uoffset_t) &&
                              BufferHasIdentifier(buf_ + start, identifier)))) {
      return false;
    }

    // Call T::Verify, which must be in the generated code for this type.
    const auto o = VerifyOffset<uoffset_t>(start);
    if (!Check(o != 0)) return false;
    if (!(reinterpret_cast<const T *>(buf_ + start + o)->Verify(*this))) {
      return false;
    }
    if (TrackVerifierBufferSize) {
      if (GetComputedSize() == 0) return false;
    }
    return true;
  }